

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

Id __thiscall
anon_unknown.dwarf_12a4996::TGlslangToSpvTraverser::createSpvConstantFromConstUnionArray
          (TGlslangToSpvTraverser *this,TType *glslangType,TConstUnionArray *consts,int *nextConst,
          bool specConstant)

{
  anon_union_8_11_a9b10978_for_TConstUnion_0 aVar1;
  TConstUnionVector *pTVar2;
  Builder *pBVar3;
  TLayoutPacking explicitLayout;
  int iVar4;
  Id IVar5;
  TBasicType t;
  uint uVar6;
  int iVar7;
  uint value;
  Id IVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar9;
  char *pcVar10;
  unsigned_long_long uVar11;
  longlong i;
  int iVar12;
  float fVar13;
  undefined4 uVar14;
  vector<unsigned_int,_std::allocator<unsigned_int>_> spvConsts;
  TType elementType;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f8;
  Builder *local_e0;
  Id local_d4;
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
  *local_d0;
  undefined1 local_c8 [152];
  
  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  explicitLayout = getExplicitLayout((TGlslangToSpvTraverser *)glslangType,glslangType);
  iVar4 = (*glslangType->_vptr_TType[0xb])(glslangType);
  IVar5 = convertGlslangToSpvType
                    (this,glslangType,explicitLayout,(TQualifier *)CONCAT44(extraout_var,iVar4),
                     false,false);
  iVar4 = (*glslangType->_vptr_TType[0x1d])(glslangType);
  if ((char)iVar4 == '\0') {
    iVar4 = (*glslangType->_vptr_TType[0x1c])(glslangType);
    if ((char)iVar4 != '\0') {
      local_e0 = (Builder *)CONCAT44(local_e0._4_4_,IVar5);
      iVar12 = 0;
      glslang::TType::TType((TType *)local_c8,glslangType,0,false);
      iVar4 = (*glslangType->_vptr_TType[0xd])(glslangType);
      if (0 < iVar4) {
        do {
          local_d4 = createSpvConstantFromConstUnionArray
                               (this,(TType *)local_c8,consts,nextConst,false);
          if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_f8,
                       (iterator)
                       local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_d4);
          }
          else {
            *local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = local_d4;
            local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          iVar12 = iVar12 + 1;
          iVar4 = (*glslangType->_vptr_TType[0xd])(glslangType);
        } while (iVar12 < iVar4);
      }
      goto LAB_0043f2f5;
    }
    if ((glslangType->field_0xa & 0x60) == 0) {
      iVar4 = (*glslangType->_vptr_TType[0x25])(glslangType);
      if ((char)iVar4 != '\0') {
        iVar4 = (*glslangType->_vptr_TType[0x25])();
        if ((char)iVar4 != '\0') {
          pcVar10 = *(char **)&((glslangType->field_13).referentType)->field_0x8;
          iVar4 = (*glslangType->_vptr_TType[0x25])(glslangType);
          if ((char)iVar4 != '\0') {
            do {
              if (pcVar10 == (((glslangType->field_13).referentType)->qualifier).semanticName)
              goto LAB_0043f2fa;
              local_c8._0_4_ =
                   createSpvConstantFromConstUnionArray
                             (this,*(TType **)pcVar10,consts,nextConst,false);
              if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          (&local_f8,
                           (iterator)
                           local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish,(uint *)local_c8);
              }
              else {
                *local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_c8._0_4_;
                local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              pcVar10 = pcVar10 + 0x20;
              iVar4 = (*glslangType->_vptr_TType[0x25])(glslangType);
            } while ((char)iVar4 != '\0');
          }
        }
        __assert_fail("isStruct()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                      ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
      }
      iVar4 = (*glslangType->_vptr_TType[0xc])(glslangType);
      if (iVar4 < 2) {
        if ((*(uint *)&glslangType->field_0x8 >> 0x1b & 1) == 0) {
          pTVar2 = consts->unionArray;
          if (pTVar2 == (TConstUnionVector *)0x0) {
            iVar4 = 0;
          }
          else {
            iVar4 = (int)((ulong)((long)(pTVar2->
                                        super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                        ).
                                        super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pTVar2->
                                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                       ).
                                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4);
          }
          iVar12 = *nextConst;
          iVar7 = (*glslangType->_vptr_TType[7])(glslangType);
          switch(iVar7) {
          case 1:
            fVar13 = 0.0;
            if (iVar12 < iVar4) {
              fVar13 = (float)(consts->unionArray->
                              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                              ).
                              super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                              ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.dConst;
            }
            IVar5 = spv::Builder::makeFloatConstant(&this->builder,fVar13,specConstant);
            break;
          case 2:
            iVar7 = 0;
            uVar14 = 0;
            if (iVar12 < iVar4) {
              aVar1 = (consts->unionArray->
                      super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ).
                      super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0;
              iVar7 = aVar1.iConst;
              uVar14 = (undefined4)((ulong)aVar1 >> 0x20);
            }
            IVar5 = spv::Builder::makeDoubleConstant
                              (&this->builder,(double)CONCAT44(uVar14,iVar7),specConstant);
            break;
          case 3:
            local_c8._0_4_ = CapabilityFloat16;
            std::
            _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
            ::_M_insert_unique<spv::Capability_const&>
                      ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                        *)&(this->builder).capabilities,(Capability *)local_c8);
            fVar13 = 0.0;
            if (iVar12 < iVar4) {
              fVar13 = (float)(consts->unionArray->
                              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                              ).
                              super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                              ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.dConst;
            }
            IVar5 = spv::Builder::makeFloat16Constant(&this->builder,fVar13,specConstant);
            break;
          case 4:
            local_c8._0_4_ = CapabilityInt8;
            std::
            _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
            ::_M_insert_unique<spv::Capability_const&>
                      ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                        *)&(this->builder).capabilities,(Capability *)local_c8);
            iVar7 = 0;
            if (iVar12 < iVar4) {
              iVar7 = (int)(consts->unionArray->
                           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ).
                           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.i8Const;
            }
            IVar5 = spv::Builder::makeInt8Constant(&this->builder,iVar7,specConstant);
            break;
          case 5:
            local_c8._0_4_ = CapabilityInt8;
            std::
            _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
            ::_M_insert_unique<spv::Capability_const&>
                      ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                        *)&(this->builder).capabilities,(Capability *)local_c8);
            uVar6 = 0;
            if (iVar12 < iVar4) {
              uVar6 = (uint)(consts->unionArray->
                            super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ).
                            super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.u8Const;
            }
            IVar5 = spv::Builder::makeUint8Constant(&this->builder,uVar6,specConstant);
            break;
          case 6:
            local_c8._0_4_ = CapabilityInt16;
            std::
            _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
            ::_M_insert_unique<spv::Capability_const&>
                      ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                        *)&(this->builder).capabilities,(Capability *)local_c8);
            iVar7 = 0;
            if (iVar12 < iVar4) {
              iVar7 = (int)(consts->unionArray->
                           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ).
                           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.i16Const;
            }
            IVar5 = spv::Builder::makeInt16Constant(&this->builder,iVar7,specConstant);
            break;
          case 7:
            local_c8._0_4_ = CapabilityInt16;
            std::
            _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
            ::_M_insert_unique<spv::Capability_const&>
                      ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                        *)&(this->builder).capabilities,(Capability *)local_c8);
            uVar6 = 0;
            if (iVar12 < iVar4) {
              uVar6 = (uint)(consts->unionArray->
                            super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ).
                            super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.u16Const;
            }
            IVar5 = spv::Builder::makeUint16Constant(&this->builder,uVar6,specConstant);
            break;
          case 8:
            iVar7 = 0;
            if (iVar12 < iVar4) {
              iVar7 = (consts->unionArray->
                      super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ).
                      super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.iConst;
            }
            IVar5 = spv::Builder::makeIntConstant(&this->builder,iVar7,specConstant);
            break;
          case 9:
            uVar6 = 0;
            if (iVar12 < iVar4) {
              uVar6 = (consts->unionArray->
                      super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ).
                      super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.uConst;
            }
            IVar5 = spv::Builder::makeUintConstant(&this->builder,uVar6,specConstant);
            break;
          case 10:
            if (iVar12 < iVar4) {
              i = (consts->unionArray->
                  super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                  ).
                  super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                  ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.i64Const;
            }
            else {
              i = 0;
            }
            IVar5 = spv::Builder::makeInt64Constant(&this->builder,i,specConstant);
            break;
          case 0xb:
            if (iVar12 < iVar4) {
              uVar11 = (consts->unionArray->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.u64Const;
            }
            else {
              uVar11 = 0;
            }
            IVar5 = spv::Builder::makeUint64Constant(&this->builder,uVar11,specConstant);
            break;
          case 0xc:
            if (iVar12 < iVar4) {
              bVar9 = (consts->unionArray->
                      super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ).
                      super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.bConst;
            }
            else {
              bVar9 = false;
            }
            IVar5 = spv::Builder::makeBoolConstant(&this->builder,bVar9,specConstant);
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                          ,0x295a,
                          "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createSpvConstantFromConstUnionArray(const glslang::TType &, const glslang::TConstUnionArray &, int &, bool)"
                         );
          case 0x12:
            if (iVar12 < iVar4) {
              uVar11 = (consts->unionArray->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.u64Const;
            }
            else {
              uVar11 = 0;
            }
            IVar8 = spv::Builder::makeUint64Constant(&this->builder,uVar11,specConstant);
            IVar5 = spv::Builder::createUnaryOp(&this->builder,OpBitcast,IVar5,IVar8);
            break;
          case 0x1b:
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_c8,
                       (((consts->unionArray->
                         super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                         ).
                         super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                         ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.sConst)->
                       _M_dataplus)._M_p,(allocator<char> *)&local_d4);
            IVar5 = spv::Builder::getStringId(&this->builder,(string *)local_c8);
            if ((undefined1 *)CONCAT44(local_c8._4_4_,local_c8._0_4_) != local_c8 + 0x10) {
              operator_delete((undefined1 *)CONCAT44(local_c8._4_4_,local_c8._0_4_),
                              (ulong)(local_c8._16_8_ + 1));
            }
          }
          *nextConst = *nextConst + 1;
          goto LAB_0043f312;
        }
LAB_0043f4db:
        iVar4 = (*glslangType->_vptr_TType[0x16])(glslangType);
        uVar6 = glslang::TSmallArrayVector::getDimSize
                          (*(TSmallArrayVector **)(CONCAT44(extraout_var_00,iVar4) + 8),0);
      }
      else {
        if ((*(uint *)&glslangType->field_0x8 >> 0x1b & 1) != 0) goto LAB_0043f4db;
        uVar6 = (*glslangType->_vptr_TType[0xc])(glslangType);
      }
      if (uVar6 != 0) {
        local_e0 = &this->builder;
        local_d0 = (_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                    *)&(this->builder).capabilities;
        iVar4 = *nextConst;
        do {
          pTVar2 = consts->unionArray;
          iVar12 = 0;
          if (pTVar2 != (TConstUnionVector *)0x0) {
            iVar12 = (int)((ulong)((long)(pTVar2->
                                         super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                         ).
                                         super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pTVar2->
                                        super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                        ).
                                        super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4);
          }
          iVar7 = (*glslangType->_vptr_TType[7])(glslangType);
          pBVar3 = local_e0;
          switch(iVar7) {
          case 1:
            fVar13 = 0.0;
            if (iVar4 < iVar12) {
              fVar13 = (float)(consts->unionArray->
                              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                              ).
                              super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                              ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.dConst;
            }
            local_c8._0_4_ = spv::Builder::makeFloatConstant(local_e0,fVar13,false);
            break;
          case 2:
            iVar7 = 0;
            uVar14 = 0;
            if (iVar4 < iVar12) {
              aVar1 = (consts->unionArray->
                      super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ).
                      super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0;
              iVar7 = aVar1.iConst;
              uVar14 = (undefined4)((ulong)aVar1 >> 0x20);
            }
            local_c8._0_4_ =
                 spv::Builder::makeDoubleConstant(local_e0,(double)CONCAT44(uVar14,iVar7),false);
            break;
          case 3:
            local_c8._0_4_ = CapabilityFloat16;
            std::
            _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
            ::_M_insert_unique<spv::Capability_const&>(local_d0,(Capability *)local_c8);
            fVar13 = 0.0;
            if (iVar4 < iVar12) {
              fVar13 = (float)(consts->unionArray->
                              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                              ).
                              super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                              ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.dConst;
            }
            local_c8._0_4_ = spv::Builder::makeFloat16Constant(local_e0,fVar13,false);
            break;
          case 4:
            local_c8._0_4_ = CapabilityInt8;
            std::
            _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
            ::_M_insert_unique<spv::Capability_const&>(local_d0,(Capability *)local_c8);
            value = 0;
            if (iVar4 < iVar12) {
              value = (uint)(consts->unionArray->
                            super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ).
                            super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.i8Const;
            }
            iVar4 = 8;
            goto LAB_0043f780;
          case 5:
            local_c8._0_4_ = CapabilityInt8;
            std::
            _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
            ::_M_insert_unique<spv::Capability_const&>(local_d0,(Capability *)local_c8);
            value = 0;
            if (iVar4 < iVar12) {
              value = (uint)(consts->unionArray->
                            super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ).
                            super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.u8Const;
            }
            iVar4 = 8;
            goto LAB_0043f82b;
          case 6:
            local_c8._0_4_ = CapabilityInt16;
            std::
            _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
            ::_M_insert_unique<spv::Capability_const&>(local_d0,(Capability *)local_c8);
            value = 0;
            if (iVar4 < iVar12) {
              value = (uint)(consts->unionArray->
                            super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ).
                            super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.i16Const;
            }
            iVar4 = 0x10;
            goto LAB_0043f780;
          case 7:
            local_c8._0_4_ = CapabilityInt16;
            std::
            _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
            ::_M_insert_unique<spv::Capability_const&>(local_d0,(Capability *)local_c8);
            value = 0;
            if (iVar4 < iVar12) {
              value = (uint)(consts->unionArray->
                            super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ).
                            super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.u16Const;
            }
            iVar4 = 0x10;
            goto LAB_0043f82b;
          case 8:
            value = 0;
            if (iVar4 < iVar12) {
              value = (consts->unionArray->
                      super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ).
                      super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.uConst;
            }
            iVar4 = 0x20;
LAB_0043f780:
            bVar9 = true;
LAB_0043f82f:
            pBVar3 = local_e0;
            IVar8 = spv::Builder::makeIntegerType(local_e0,iVar4,bVar9);
            local_c8._0_4_ = spv::Builder::makeIntConstant(pBVar3,IVar8,value,false);
            break;
          case 9:
            value = 0;
            if (iVar4 < iVar12) {
              value = (consts->unionArray->
                      super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ).
                      super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.uConst;
            }
            iVar4 = 0x20;
LAB_0043f82b:
            bVar9 = false;
            goto LAB_0043f82f;
          case 10:
            if (iVar4 < iVar12) {
              uVar11 = (consts->unionArray->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.u64Const;
            }
            else {
              uVar11 = 0;
            }
            bVar9 = true;
            goto LAB_0043f87e;
          case 0xb:
            if (iVar4 < iVar12) {
              uVar11 = (consts->unionArray->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.u64Const;
            }
            else {
              uVar11 = 0;
            }
            bVar9 = false;
LAB_0043f87e:
            IVar8 = spv::Builder::makeIntegerType(local_e0,0x40,bVar9);
            local_c8._0_4_ = spv::Builder::makeInt64Constant(pBVar3,IVar8,uVar11,false);
            break;
          case 0xc:
            if (iVar4 < iVar12) {
              bVar9 = (consts->unionArray->
                      super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ).
                      super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ._M_impl.super__Vector_impl_data._M_start[*nextConst].field_0.bConst;
            }
            else {
              bVar9 = false;
            }
            local_c8._0_4_ = spv::Builder::makeBoolConstant(local_e0,bVar9,false);
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                          ,0x291f,
                          "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createSpvConstantFromConstUnionArray(const glslang::TType &, const glslang::TConstUnionArray &, int &, bool)"
                         );
          }
          if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_f8,
                       (iterator)
                       local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)local_c8);
          }
          else {
            *local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = local_c8._0_4_;
            local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          iVar4 = *nextConst + 1;
          *nextConst = iVar4;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
    }
    else {
      t = (*glslangType->_vptr_TType[7])(glslangType);
      glslang::TType::TType((TType *)local_c8,t,EvqTemporary,1,0,0,false);
      local_d4 = createSpvConstantFromConstUnionArray(this,(TType *)local_c8,consts,nextConst,false)
      ;
      if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_f8,
                   (iterator)
                   local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_d4);
      }
      else {
        *local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = local_d4;
        local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
  }
  else {
    local_e0 = (Builder *)CONCAT44(local_e0._4_4_,IVar5);
    iVar12 = 0;
    glslang::TType::TType((TType *)local_c8,glslangType,0,false);
    iVar4 = (*glslangType->_vptr_TType[0xf])(glslangType);
    if (0 < iVar4) {
      do {
        local_d4 = createSpvConstantFromConstUnionArray
                             (this,(TType *)local_c8,consts,nextConst,false);
        if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_f8,
                     (iterator)
                     local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_d4);
        }
        else {
          *local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_d4;
          local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        iVar12 = iVar12 + 1;
        iVar4 = (*glslangType->_vptr_TType[0xf])(glslangType);
      } while (iVar12 < iVar4);
    }
LAB_0043f2f5:
    IVar5 = (Id)local_e0;
  }
LAB_0043f2fa:
  IVar5 = spv::Builder::makeCompositeConstant(&this->builder,IVar5,&local_f8,false);
LAB_0043f312:
  if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return IVar5;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createSpvConstantFromConstUnionArray(const glslang::TType& glslangType,
    const glslang::TConstUnionArray& consts, int& nextConst, bool specConstant)
{
    // vector of constants for SPIR-V
    std::vector<spv::Id> spvConsts;

    // Type is used for struct and array constants
    spv::Id typeId = convertGlslangToSpvType(glslangType);

    if (glslangType.isArray()) {
        glslang::TType elementType(glslangType, 0);
        for (int i = 0; i < glslangType.getOuterArraySize(); ++i)
            spvConsts.push_back(createSpvConstantFromConstUnionArray(elementType, consts, nextConst, false));
    } else if (glslangType.isMatrix()) {
        glslang::TType vectorType(glslangType, 0);
        for (int col = 0; col < glslangType.getMatrixCols(); ++col)
            spvConsts.push_back(createSpvConstantFromConstUnionArray(vectorType, consts, nextConst, false));
    } else if (glslangType.isCoopMat()) {
        glslang::TType componentType(glslangType.getBasicType());
        spvConsts.push_back(createSpvConstantFromConstUnionArray(componentType, consts, nextConst, false));
    } else if (glslangType.isStruct()) {
        glslang::TVector<glslang::TTypeLoc>::const_iterator iter;
        for (iter = glslangType.getStruct()->begin(); iter != glslangType.getStruct()->end(); ++iter)
            spvConsts.push_back(createSpvConstantFromConstUnionArray(*iter->type, consts, nextConst, false));
    } else if (glslangType.getVectorSize() > 1 || glslangType.isCoopVecNV()) {
        unsigned int numComponents = glslangType.isCoopVecNV() ? glslangType.getTypeParameters()->arraySizes->getDimSize(0) : glslangType.getVectorSize();
        for (unsigned int i = 0; i < numComponents; ++i) {
            bool zero = nextConst >= consts.size();
            switch (glslangType.getBasicType()) {
            case glslang::EbtInt:
                spvConsts.push_back(builder.makeIntConstant(zero ? 0 : consts[nextConst].getIConst()));
                break;
            case glslang::EbtUint:
                spvConsts.push_back(builder.makeUintConstant(zero ? 0 : consts[nextConst].getUConst()));
                break;
            case glslang::EbtFloat:
                spvConsts.push_back(builder.makeFloatConstant(zero ? 0.0F : (float)consts[nextConst].getDConst()));
                break;
            case glslang::EbtBool:
                spvConsts.push_back(builder.makeBoolConstant(zero ? false : consts[nextConst].getBConst()));
                break;
            case glslang::EbtInt8:
                builder.addCapability(spv::CapabilityInt8);
                spvConsts.push_back(builder.makeInt8Constant(zero ? 0 : consts[nextConst].getI8Const()));
                break;
            case glslang::EbtUint8:
                builder.addCapability(spv::CapabilityInt8);
                spvConsts.push_back(builder.makeUint8Constant(zero ? 0 : consts[nextConst].getU8Const()));
                break;
            case glslang::EbtInt16:
                builder.addCapability(spv::CapabilityInt16);
                spvConsts.push_back(builder.makeInt16Constant(zero ? 0 : consts[nextConst].getI16Const()));
                break;
            case glslang::EbtUint16:
                builder.addCapability(spv::CapabilityInt16);
                spvConsts.push_back(builder.makeUint16Constant(zero ? 0 : consts[nextConst].getU16Const()));
                break;
            case glslang::EbtInt64:
                spvConsts.push_back(builder.makeInt64Constant(zero ? 0 : consts[nextConst].getI64Const()));
                break;
            case glslang::EbtUint64:
                spvConsts.push_back(builder.makeUint64Constant(zero ? 0 : consts[nextConst].getU64Const()));
                break;
            case glslang::EbtDouble:
                spvConsts.push_back(builder.makeDoubleConstant(zero ? 0.0 : consts[nextConst].getDConst()));
                break;
            case glslang::EbtFloat16:
                builder.addCapability(spv::CapabilityFloat16);
                spvConsts.push_back(builder.makeFloat16Constant(zero ? 0.0F : (float)consts[nextConst].getDConst()));
                break;
            default:
                assert(0);
                break;
            }
            ++nextConst;
        }
    } else {
        // we have a non-aggregate (scalar) constant
        bool zero = nextConst >= consts.size();
        spv::Id scalar = 0;
        switch (glslangType.getBasicType()) {
        case glslang::EbtInt:
            scalar = builder.makeIntConstant(zero ? 0 : consts[nextConst].getIConst(), specConstant);
            break;
        case glslang::EbtUint:
            scalar = builder.makeUintConstant(zero ? 0 : consts[nextConst].getUConst(), specConstant);
            break;
        case glslang::EbtFloat:
            scalar = builder.makeFloatConstant(zero ? 0.0F : (float)consts[nextConst].getDConst(), specConstant);
            break;
        case glslang::EbtBool:
            scalar = builder.makeBoolConstant(zero ? false : consts[nextConst].getBConst(), specConstant);
            break;
        case glslang::EbtInt8:
            builder.addCapability(spv::CapabilityInt8);
            scalar = builder.makeInt8Constant(zero ? 0 : consts[nextConst].getI8Const(), specConstant);
            break;
        case glslang::EbtUint8:
            builder.addCapability(spv::CapabilityInt8);
            scalar = builder.makeUint8Constant(zero ? 0 : consts[nextConst].getU8Const(), specConstant);
            break;
        case glslang::EbtInt16:
            builder.addCapability(spv::CapabilityInt16);
            scalar = builder.makeInt16Constant(zero ? 0 : consts[nextConst].getI16Const(), specConstant);
            break;
        case glslang::EbtUint16:
            builder.addCapability(spv::CapabilityInt16);
            scalar = builder.makeUint16Constant(zero ? 0 : consts[nextConst].getU16Const(), specConstant);
            break;
        case glslang::EbtInt64:
            scalar = builder.makeInt64Constant(zero ? 0 : consts[nextConst].getI64Const(), specConstant);
            break;
        case glslang::EbtUint64:
            scalar = builder.makeUint64Constant(zero ? 0 : consts[nextConst].getU64Const(), specConstant);
            break;
        case glslang::EbtDouble:
            scalar = builder.makeDoubleConstant(zero ? 0.0 : consts[nextConst].getDConst(), specConstant);
            break;
        case glslang::EbtFloat16:
            builder.addCapability(spv::CapabilityFloat16);
            scalar = builder.makeFloat16Constant(zero ? 0.0F : (float)consts[nextConst].getDConst(), specConstant);
            break;
        case glslang::EbtReference:
            scalar = builder.makeUint64Constant(zero ? 0 : consts[nextConst].getU64Const(), specConstant);
            scalar = builder.createUnaryOp(spv::OpBitcast, typeId, scalar);
            break;
        case glslang::EbtString:
            scalar = builder.getStringId(consts[nextConst].getSConst()->c_str());
            break;
        default:
            assert(0);
            break;
        }
        ++nextConst;
        return scalar;
    }

    return builder.makeCompositeConstant(typeId, spvConsts);
}